

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O2

optional<float> * __thiscall pstd::optional<float>::operator=(optional<float> *this,float *v)

{
  reset(this);
  this->optionalValue = (aligned_storage_t<sizeof(float),_alignof(float)>)*v;
  this->set = true;
  return this;
}

Assistant:

PBRT_CPU_GPU
    optional &operator=(const T &v) {
        reset();
        new (ptr()) T(v);
        set = true;
        return *this;
    }